

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundUnnestExpression::Deserialize(BoundUnnestExpression *this,Deserializer *deserializer)

{
  BoundUnnestExpression *this_00;
  pointer pBVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundUnnestExpression_*,_false> local_58;
  LogicalType return_type;
  LogicalType local_38;
  
  Deserializer::ReadProperty<duckdb::LogicalType>(&return_type,deserializer,200,"return_type");
  this_00 = (BoundUnnestExpression *)operator_new(0x60);
  LogicalType::LogicalType(&local_38,&return_type);
  BoundUnnestExpression(this_00,&local_38);
  local_58._M_head_impl = this_00;
  LogicalType::~LogicalType(&local_38);
  pBVar1 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                         *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0xc9,"child",&pBVar1->child);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_58._M_head_impl;
  LogicalType::~LogicalType(&return_type);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundUnnestExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto result = duckdb::unique_ptr<BoundUnnestExpression>(new BoundUnnestExpression(std::move(return_type)));
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(201, "child", result->child);
	return std::move(result);
}